

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O0

int av1_joint_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int_mv *cur_mv,uint8_t *mask,
              int mask_stride,int *rate_mv,int allow_second_mv,int joint_me_num_refine_iter)

{
  undefined8 uVar1;
  int iVar2;
  MV mv;
  int iVar3;
  search_site sVar4;
  undefined8 *puVar5;
  undefined4 *in_RCX;
  buf_2d *pbVar6;
  byte in_DL;
  long lVar7;
  long in_RSI;
  long in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  int *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int_mv curr_ref_mv;
  int thissme;
  MV subpel_start_mv;
  MV this_best_mv;
  MV start_mv;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  uint sse;
  int dis;
  int i_1;
  int try_second;
  FULLPEL_MV start_fullmv;
  search_site_config *src_search_sites;
  SEARCH_METHODS search_method;
  MV_SPEED_FEATURES *mv_sf;
  FULLPEL_MV_STATS best_mv_stats;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  int i;
  int_mv init_int_mv;
  int_mv cur_int_mv;
  int id;
  int bestsme;
  buf_2d ref_yv12 [2];
  int_mv second_best_mv;
  int_mv best_mv;
  uint8_t *second_pred;
  uint8_t second_pred16 [32768];
  YV12_BUFFER_CONFIG *scaled_ref_frame [2];
  int last_besterr [2];
  buf_2d backup_yv12 [2] [3];
  int mi_col;
  int mi_row;
  InterPredParams inter_pred_params;
  int_interpfilters interp_filters;
  int ref;
  int ite;
  int_mv ref_mv [2];
  MvCosts *mv_costs;
  int refs [2];
  int_mv init_mv [2];
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int plane;
  int ph;
  int pw;
  int num_planes;
  AV1_COMMON *cm;
  search_site in_stack_ffffffffffff7ac8;
  InterPredParams *inter_pred_params_00;
  SEARCH_METHODS search_method_00;
  int_mv *in_stack_ffffffffffff7ad0;
  undefined4 uVar8;
  MACROBLOCK *x_00;
  MV *in_stack_ffffffffffff7ad8;
  undefined4 uVar9;
  AV1_COMP *cpi_00;
  int in_stack_ffffffffffff7ae0;
  int in_stack_ffffffffffff7ae4;
  MACROBLOCK *in_stack_ffffffffffff7ae8;
  MACROBLOCK *x_01;
  int_interpfilters iVar10;
  int in_stack_ffffffffffff7afc;
  InterPredParams *in_stack_ffffffffffff7b00;
  int local_84f8;
  int_interpfilters in_stack_ffffffffffff7b0c;
  int_interpfilters interp_filters_00;
  uint in_stack_ffffffffffff7b10;
  uint in_stack_ffffffffffff7b14;
  int in_stack_ffffffffffff7b18;
  int in_stack_ffffffffffff7b1c;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffff7b20;
  long in_stack_ffffffffffff7b28;
  int in_stack_ffffffffffff7b30;
  undefined4 in_stack_ffffffffffff7b34;
  int in_stack_ffffffffffff7b38;
  FULLPEL_MV in_stack_ffffffffffff7b40;
  MV in_stack_ffffffffffff7b44;
  buf_2d *in_stack_ffffffffffff7b48;
  int in_stack_ffffffffffff7b50;
  BLOCK_SIZE in_stack_ffffffffffff7b57;
  undefined1 in_stack_ffffffffffff7b58;
  undefined7 in_stack_ffffffffffff7b59;
  AV1_COMP *in_stack_ffffffffffff7b60;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffff7b68;
  undefined4 in_stack_ffffffffffff7b70;
  FULLPEL_MV in_stack_ffffffffffff7b74;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffff7b78;
  undefined4 in_stack_ffffffffffff7b80;
  FULLPEL_MV in_stack_ffffffffffff7b84;
  SEARCH_METHODS in_stack_ffffffffffff7b88;
  int in_stack_ffffffffffff7b90;
  MSBuffers MStack_8450;
  int_mv local_840c;
  undefined1 local_8408 [4];
  int local_8404;
  FULLPEL_MV local_8400;
  FULLPEL_MV local_83fc;
  search_site local_83f8;
  byte local_83e9;
  search_site local_83e8;
  search_site in_stack_ffffffffffff7c38;
  search_site in_stack_ffffffffffff7c40;
  search_site in_stack_ffffffffffff7c48;
  int in_stack_ffffffffffff7c54;
  search_site in_stack_ffffffffffff7c58;
  FULLPEL_MV in_stack_ffffffffffff7c60;
  search_site in_stack_ffffffffffff7c70;
  undefined1 local_82f0 [48];
  FULLPEL_MV local_82c0;
  int_mv local_82bc;
  FULLPEL_MV local_82b8;
  FULLPEL_MV local_82b4;
  FULLPEL_MV local_82b0;
  int local_82ac;
  undefined1 local_82a8 [80];
  uint8_t local_8258 [32768];
  YV12_BUFFER_CONFIG *local_258 [3];
  int local_240 [2];
  undefined8 local_238 [24];
  int local_178;
  int local_174;
  YV12_BUFFER_CONFIG YStack_140;
  undefined4 local_70;
  undefined4 local_6c;
  long local_68;
  MACROBLOCKD *local_60;
  undefined4 local_58;
  uint local_54;
  uint local_50;
  FULLPEL_MV local_4c;
  AV1_COMMON *local_48;
  int local_3c;
  uint8_t *local_38;
  undefined4 *local_30;
  byte local_21;
  long local_20;
  long local_18;
  
  local_48 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_3c = in_R9D;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_21 = in_DL;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_4c = (FULLPEL_MV)av1_num_planes(local_48);
  local_50 = (uint)block_size_wide[local_21];
  local_54 = (uint)block_size_high[local_21];
  local_58 = 0;
  local_60 = (MACROBLOCKD *)(local_20 + 0x1a0);
  local_68 = **(long **)(local_20 + 0x2058);
  local_70 = *local_30;
  local_6c = local_30[1];
  YStack_140.metadata._0_4_ = (int)*(char *)(local_68 + 0x10);
  YStack_140.metadata._4_4_ = (int)*(char *)(local_68 + 0x11);
  YStack_140._192_8_ = *(undefined8 *)(local_20 + 0xb9c8);
  YStack_140.chroma_sample_position =
       (aom_chroma_sample_position_t)av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
  local_174 = local_60->mi_row;
  local_178 = local_60->mi_col;
  local_240[0] = 0x7fffffff;
  local_240[1] = 0x7fffffff;
  local_258[0] = av1_get_scaled_ref_frame
                           ((AV1_COMP *)
                            CONCAT44(in_stack_ffffffffffff7ae4,in_stack_ffffffffffff7ae0),
                            (int)((ulong)in_stack_ffffffffffff7ad8 >> 0x20));
  local_258[1] = av1_get_scaled_ref_frame
                           ((AV1_COMP *)
                            CONCAT44(in_stack_ffffffffffff7ae4,in_stack_ffffffffffff7ae0),
                            (int)((ulong)in_stack_ffffffffffff7ad8 >> 0x20));
  sVar4 = (search_site)get_buf_by_bd(local_60,local_8258);
  local_82a8._72_2_ = sVar4.mv.row;
  local_82a8._74_2_ = sVar4.mv.col;
  local_82a8._76_4_ = sVar4.offset;
  for (YStack_140.render_width = 0;
      SBORROW4(YStack_140.render_width,in_stack_00000018 * 2) !=
      YStack_140.render_width + in_stack_00000018 * -2 < 0;
      YStack_140.render_width = YStack_140.render_width + 1) {
    local_82ac = 0x7fffffff;
    local_82b0 = (FULLPEL_MV)(YStack_140.render_width % 2);
    if ((1 < YStack_140.render_width) &&
       (local_30[(int)(uint)((local_82b0 != (FULLPEL_MV)0x0 ^ 0xffU) & 1)] ==
        (&local_70)[(int)(uint)((local_82b0 != (FULLPEL_MV)0x0 ^ 0xffU) & 1)])) {
      if (local_30[(int)local_82b0] == (&local_70)[(int)local_82b0]) break;
      local_82b4.col = *(short *)((long)local_30 + (long)(int)local_82b0 * 4 + 2) >> 3;
      local_82b4.row = *(short *)(local_30 + (int)local_82b0) >> 3;
      local_82b8.col = *(short *)((long)&local_70 + (long)(int)local_82b0 * 4 + 2) >> 3;
      local_82b8.row = *(short *)(&local_70 + (int)local_82b0) >> 3;
      if (local_82b4 == local_82b8) break;
    }
    YStack_140.color_range = AOM_CR_STUDIO_RANGE;
    interp_filters_00 = in_stack_ffffffffffff7b0c;
    while( true ) {
      uVar9 = (undefined4)((ulong)in_stack_ffffffffffff7ad8 >> 0x20);
      uVar8 = (undefined4)((ulong)in_stack_ffffffffffff7ad0 >> 0x20);
      if (1 < (int)YStack_140.color_range) break;
      in_stack_ffffffffffff7b28 = (long)(int)YStack_140.color_range;
      local_82bc = av1_get_ref_mv(in_stack_ffffffffffff7ae8,in_stack_ffffffffffff7ae4);
      *(int_mv *)((long)YStack_140.store_buf_adr + in_stack_ffffffffffff7b28 * 4 + 0x70) =
           local_82bc;
      if (local_258[(int)YStack_140.color_range] != (YV12_BUFFER_CONFIG *)0x0) {
        local_82c0.row = 0;
        local_82c0.col = 0;
        for (; (int)local_82c0 < (int)local_4c; local_82c0 = (FULLPEL_MV)((int)local_82c0 + 1)) {
          puVar5 = local_238 + (long)(int)YStack_140.color_range * 0xc + (long)(int)local_82c0 * 4;
          pbVar6 = local_60->plane[(int)local_82c0].pre + (int)YStack_140.color_range;
          *puVar5 = pbVar6->buf;
          puVar5[1] = pbVar6->buf0;
          puVar5[2] = *(undefined8 *)&pbVar6->width;
          puVar5[3] = *(undefined8 *)&pbVar6->stride;
        }
        in_stack_ffffffffffff7ac8.mv = local_4c;
        av1_setup_pre_planes
                  ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffff7b34,in_stack_ffffffffffff7b30),
                   (int)((ulong)in_stack_ffffffffffff7b28 >> 0x20),in_stack_ffffffffffff7b20,
                   in_stack_ffffffffffff7b1c,in_stack_ffffffffffff7b18,
                   (scale_factors *)CONCAT44(in_stack_ffffffffffff7b14,in_stack_ffffffffffff7b10),
                   in_stack_ffffffffffff7b50);
      }
      YStack_140.color_range = YStack_140.color_range + AOM_CR_FULL_RANGE;
    }
    local_82a8._0_8_ = local_60->plane[0].pre[0].buf;
    local_82a8._8_8_ = local_60->plane[0].pre[0].buf0;
    local_82a8._16_4_ = local_60->plane[0].pre[0].width;
    local_82a8._20_4_ = local_60->plane[0].pre[0].height;
    local_82a8._24_4_ = (FULLPEL_MV)local_60->plane[0].pre[0].stride;
    local_82a8._28_4_ = *(int *)&local_60->plane[0].pre[0].field_0x1c;
    local_82a8._32_8_ = *(search_site *)(local_60->plane[0].pre + 1);
    local_82a8._40_8_ = local_60->plane[0].pre[1].buf0;
    local_82a8._48_4_ = (FULLPEL_MV)local_60->plane[0].pre[1].width;
    local_82a8._52_4_ = local_60->plane[0].pre[1].height;
    local_82a8._56_4_ = (FULLPEL_MV)local_60->plane[0].pre[1].stride;
    local_82a8._60_4_ = *(int *)&local_60->plane[0].pre[1].field_0x1c;
    in_stack_ffffffffffff7b18 = local_174 << 2;
    in_stack_ffffffffffff7b1c = local_178 << 2;
    iVar3 = local_60->bd;
    in_stack_ffffffffffff7b10 = local_50;
    in_stack_ffffffffffff7b14 = local_54;
    iVar2 = is_cur_buf_hbd(local_60);
    in_stack_ffffffffffff7ae8 = (MACROBLOCK *)&local_48->sf_identity;
    x_01 = (MACROBLOCK *)
           (local_82a8 + (long)(int)(uint)((local_82b0 != (FULLPEL_MV)0x0 ^ 0xffU) & 1) * 0x20);
    inter_pred_params_00 =
         (InterPredParams *)((ulong)in_stack_ffffffffffff7ac8 & 0xffffffff00000000);
    x_00 = (MACROBLOCK *)CONCAT44(uVar8,iVar3);
    cpi_00 = (AV1_COMP *)CONCAT44(uVar9,iVar2);
    in_stack_ffffffffffff7ae0 = 0;
    iVar10 = (int_interpfilters)YStack_140.chroma_sample_position;
    av1_init_inter_params
              (in_stack_ffffffffffff7b00,in_stack_ffffffffffff7afc,YStack_140.chroma_sample_position
               ,(int)((ulong)x_01 >> 0x20),(int)x_01,(int)((ulong)in_stack_ffffffffffff7ae8 >> 0x20)
               ,(int)in_stack_ffffffffffff7b20,(int)in_stack_ffffffffffff7b28,
               in_stack_ffffffffffff7b30,in_stack_ffffffffffff7b38,
               (scale_factors *)CONCAT44(in_stack_ffffffffffff7b44,in_stack_ffffffffffff7b40),
               in_stack_ffffffffffff7b48,interp_filters_00);
    in_stack_ffffffffffff7b20 = &YStack_140;
    get_conv_params(in_stack_ffffffffffff7ae4,in_stack_ffffffffffff7ae0,(int)((ulong)cpi_00 >> 0x20)
                   );
    memcpy(in_stack_ffffffffffff7b20,local_82f0,0x30);
    av1_enc_build_one_inter_predictor
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff7ae4,in_stack_ffffffffffff7ae0),
               (int)((ulong)cpi_00 >> 0x20),(MV *)x_00,inter_pred_params_00);
    search_method_00 = (SEARCH_METHODS)((ulong)inter_pred_params_00 >> 0x38);
    if (local_82b0 != (FULLPEL_MV)0x0) {
      lVar7 = (long)(int)local_82b0 * 0x20;
      local_60->plane[0].pre[0].buf = *(uint8_t **)(local_82a8 + lVar7);
      local_60->plane[0].pre[0].buf0 = *(uint8_t **)(local_82a8 + lVar7 + 8);
      uVar1 = *(undefined8 *)(local_82a8 + lVar7 + 0x10);
      local_60->plane[0].pre[0].width = (int)uVar1;
      local_60->plane[0].pre[0].height = (int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&local_60->plane[0].pre[0].stride = *(undefined8 *)(local_82a8 + lVar7 + 0x18);
    }
    local_83e8 = (search_site)(local_18 + 0x609e8);
    local_83e9 = av1_get_default_mv_search_method
                           (x_01,(MV_SPEED_FEATURES *)in_stack_ffffffffffff7ae8,
                            (BLOCK_SIZE)((uint)in_stack_ffffffffffff7ae4 >> 0x18));
    local_83f8 = (search_site)av1_get_search_site_config(cpi_00,x_00,search_method_00);
    uVar8 = (undefined4)((ulong)x_00 >> 0x20);
    local_83fc = get_fullmv_from_mv((MV *)(local_30 + (int)local_82b0));
    in_stack_ffffffffffff7ad0 = (int_mv *)CONCAT44(uVar8,(uint)local_83e9);
    in_stack_ffffffffffff7ad8 = (MV *)((ulong)cpi_00 & 0xffffffff00000000);
    in_stack_ffffffffffff7ac8 = local_83f8;
    av1_make_default_fullpel_ms_params
              (in_stack_ffffffffffff7b68,in_stack_ffffffffffff7b60,
               (MACROBLOCK *)CONCAT71(in_stack_ffffffffffff7b59,in_stack_ffffffffffff7b58),
               in_stack_ffffffffffff7b57,(MV *)in_stack_ffffffffffff7b48,in_stack_ffffffffffff7b74,
               (search_site_config *)CONCAT44(in_stack_ffffffffffff7b84,in_stack_ffffffffffff7b80),
               in_stack_ffffffffffff7b88,in_stack_ffffffffffff7b90);
    av1_set_ms_compound_refs
              ((MSBuffers *)&stack0xffffffffffff7c40,(uint8_t *)local_82a8._72_8_,local_38,local_3c,
               (int)local_82b0);
    if ((*(int *)((long)local_83e8 + 0x78) == 0) && (*(char *)(local_68 + 0x53) != '\x02')) {
      in_stack_ffffffffffff7ac8 = (search_site)((long)local_82a8 + 0x40);
      local_82ac = av1_full_pixel_search
                             (in_stack_ffffffffffff7c60,
                              (FULLPEL_MOTION_SEARCH_PARAMS *)in_stack_ffffffffffff7c58,
                              in_stack_ffffffffffff7c54,(int *)in_stack_ffffffffffff7c48,
                              (FULLPEL_MV *)in_stack_ffffffffffff7c40,
                              (FULLPEL_MV_STATS *)in_stack_ffffffffffff7c38,
                              (FULLPEL_MV *)in_stack_ffffffffffff7c70);
    }
    else {
      local_82ac = av1_refining_search_8p_c
                             (in_stack_ffffffffffff7b78,in_stack_ffffffffffff7b84,
                              (FULLPEL_MV *)
                              CONCAT44(in_stack_ffffffffffff7b74,in_stack_ffffffffffff7b70));
      local_82a8._64_4_ = local_82a8._68_4_;
    }
    in_stack_ffffffffffff7b0c.as_int = interp_filters_00.as_int & 0xffffff;
    if (((FULLPEL_MV)local_82a8._64_4_ != (FULLPEL_MV)0x80008000) &&
       (in_stack_ffffffffffff7b0c.as_int = interp_filters_00.as_int & 0xffffff,
       local_82a8._64_4_ != local_82a8._68_4_)) {
      in_stack_ffffffffffff7b0c._0_3_ = (undefined3)interp_filters_00.as_int;
      in_stack_ffffffffffff7b0c.as_int._3_1_ = in_stack_00000010 != 0;
    }
    local_8400 = (FULLPEL_MV)(in_stack_ffffffffffff7b0c.as_int >> 0x18);
    if (local_82b0 != (FULLPEL_MV)0x0) {
      local_60->plane[0].pre[0].buf = (uint8_t *)local_82a8._0_8_;
      local_60->plane[0].pre[0].buf0 = (uint8_t *)local_82a8._8_8_;
      local_60->plane[0].pre[0].width = local_82a8._16_4_;
      local_60->plane[0].pre[0].height = local_82a8._20_4_;
      *(undefined8 *)&local_60->plane[0].pre[0].stride = local_82a8._24_8_;
    }
    for (YStack_140.color_range = AOM_CR_STUDIO_RANGE; (int)YStack_140.color_range < 2;
        YStack_140.color_range = YStack_140.color_range + AOM_CR_FULL_RANGE) {
      if (local_258[(int)YStack_140.color_range] != (YV12_BUFFER_CONFIG *)0x0) {
        for (local_8404 = 0; local_8404 < (int)local_4c; local_8404 = local_8404 + 1) {
          pbVar6 = local_60->plane[local_8404].pre + (int)YStack_140.color_range;
          puVar5 = local_238 + (long)(int)YStack_140.color_range * 0xc + (long)local_8404 * 4;
          pbVar6->buf = (uint8_t *)*puVar5;
          pbVar6->buf0 = (uint8_t *)puVar5[1];
          uVar1 = puVar5[2];
          pbVar6->width = (int)uVar1;
          pbVar6->height = (int)((ulong)uVar1 >> 0x20);
          *(undefined8 *)&pbVar6->stride = puVar5[3];
        }
        lVar7 = (long)(int)YStack_140.color_range * 0x20;
        pbVar6 = local_60->plane[0].pre + (int)YStack_140.color_range;
        *(uint8_t **)(local_82a8 + lVar7) = pbVar6->buf;
        *(uint8_t **)(local_82a8 + lVar7 + 8) = pbVar6->buf0;
        *(undefined8 *)(local_82a8 + lVar7 + 0x10) = *(undefined8 *)&pbVar6->width;
        *(undefined8 *)(local_82a8 + lVar7 + 0x18) = *(undefined8 *)&pbVar6->stride;
      }
    }
    if (local_82b0 != (FULLPEL_MV)0x0) {
      lVar7 = (long)(int)local_82b0 * 0x20;
      local_60->plane[0].pre[0].buf = *(uint8_t **)(local_82a8 + lVar7);
      local_60->plane[0].pre[0].buf0 = *(uint8_t **)(local_82a8 + lVar7 + 8);
      uVar1 = *(undefined8 *)(local_82a8 + lVar7 + 0x10);
      local_60->plane[0].pre[0].width = (int)uVar1;
      local_60->plane[0].pre[0].height = (int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&local_60->plane[0].pre[0].stride = *(undefined8 *)(local_82a8 + lVar7 + 0x18);
    }
    if ((*(byte *)(local_18 + 0x3c16e) & 1) != 0) {
      convert_fullmv_to_mv(in_stack_ffffffffffff7ad0);
    }
    if ((local_82ac < 0x7fffffff) && ((*(byte *)(local_18 + 0x3c16e) & 1) == 0)) {
      av1_make_default_subpel_ms_params
                ((SUBPEL_MOTION_SEARCH_PARAMS *)in_stack_ffffffffffff7b20,
                 (AV1_COMP *)CONCAT44(in_stack_ffffffffffff7b1c,in_stack_ffffffffffff7b18),
                 (MACROBLOCK *)CONCAT44(in_stack_ffffffffffff7b14,in_stack_ffffffffffff7b10),
                 (BLOCK_SIZE)((uint)in_stack_ffffffffffff7b0c >> 0x18),
                 (MV *)in_stack_ffffffffffff7b00,
                 (int *)CONCAT44(in_stack_ffffffffffff7afc,iVar10.as_int));
      av1_set_ms_compound_refs
                (&MStack_8450,(uint8_t *)local_82a8._72_8_,local_38,local_3c,(int)local_82b0);
      in_stack_ffffffffffff7b58 = 0;
      in_stack_ffffffffffff7b44 = get_mv_from_fullmv((FULLPEL_MV *)(local_82a8 + 0x44));
      in_stack_ffffffffffff7ac8 = (search_site)local_8408;
      in_stack_ffffffffffff7ad0 = &local_840c;
      in_stack_ffffffffffff7ad8 = (MV *)0x0;
      local_82ac = (**(code **)(local_18 + 0x60e00))
                             (local_60,local_48,&stack0xffffffffffff7b48,in_stack_ffffffffffff7b44,0
                              ,local_82a8 + 0x44);
      if (local_8400 != (FULLPEL_MV)0x0) {
        mv = get_mv_from_fullmv((FULLPEL_MV *)(local_82a8 + 0x40));
        iVar3 = av1_is_subpelmv_in_range((SubpelMvLimits *)&stack0xffffffffffff7b60,mv);
        if (iVar3 != 0) {
          in_stack_ffffffffffff7ac8 = (search_site)local_8408;
          in_stack_ffffffffffff7ad0 = &local_840c;
          in_stack_ffffffffffff7ad8 = (MV *)0x0;
          in_stack_ffffffffffff7b38 =
               (**(code **)(local_18 + 0x60e00))
                         (local_60,local_48,&stack0xffffffffffff7b48,mv,0,&stack0xffffffffffff7b40);
          if (in_stack_ffffffffffff7b38 < local_82ac) {
            local_82a8._68_2_ = in_stack_ffffffffffff7b40.row;
            local_82a8._70_2_ = in_stack_ffffffffffff7b40.col;
            local_82ac = in_stack_ffffffffffff7b38;
          }
        }
      }
    }
    if (local_82b0 != (FULLPEL_MV)0x0) {
      local_60->plane[0].pre[0].buf = (uint8_t *)local_82a8._0_8_;
      local_60->plane[0].pre[0].buf0 = (uint8_t *)local_82a8._8_8_;
      local_60->plane[0].pre[0].width = local_82a8._16_4_;
      local_60->plane[0].pre[0].height = local_82a8._20_4_;
      *(undefined8 *)&local_60->plane[0].pre[0].stride = local_82a8._24_8_;
    }
    if (*(int *)((long)local_238 + (long)(int)local_82b0 * 4 + -8) <= local_82ac) break;
    ((FULLPEL_MV *)(local_30 + (int)local_82b0))->row = local_82a8._68_2_;
    ((FULLPEL_MV *)(local_30 + (int)local_82b0))->col = local_82a8._70_2_;
    *(int *)((long)local_238 + (long)(int)local_82b0 * 4 + -8) = local_82ac;
  }
  *in_stack_00000008 = 0;
  for (YStack_140.color_range = AOM_CR_STUDIO_RANGE; (int)YStack_140.color_range < 2;
      YStack_140.color_range = YStack_140.color_range + AOM_CR_FULL_RANGE) {
    av1_get_ref_mv(in_stack_ffffffffffff7ae8,in_stack_ffffffffffff7ae4);
    iVar3 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_ffffffffffff7ae4,in_stack_ffffffffffff7ae0),
                            in_stack_ffffffffffff7ad8,(int *)&in_stack_ffffffffffff7ad0->as_int,
                            (int **)in_stack_ffffffffffff7ac8,0);
    *in_stack_00000008 = iVar3 + *in_stack_00000008;
  }
  if (local_240[0] < local_240[1]) {
    local_84f8 = local_240[0];
  }
  else {
    local_84f8 = local_240[1];
  }
  return local_84f8;
}

Assistant:

int av1_joint_motion_search(const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, int_mv *cur_mv,
                            const uint8_t *mask, int mask_stride, int *rate_mv,
                            int allow_second_mv, int joint_me_num_refine_iter) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const int pw = block_size_wide[bsize];
  const int ph = block_size_high[bsize];
  const int plane = 0;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  // This function should only ever be called for compound modes
  assert(has_second_ref(mbmi));
  const int_mv init_mv[2] = { cur_mv[0], cur_mv[1] };
  const int refs[2] = { mbmi->ref_frame[0], mbmi->ref_frame[1] };
  const MvCosts *mv_costs = x->mv_costs;
  int_mv ref_mv[2];
  int ite, ref;

  // Get the prediction block from the 'other' reference frame.
  const int_interpfilters interp_filters =
      av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  InterPredParams inter_pred_params;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Do joint motion search in compound mode to get more accurate mv.
  struct buf_2d backup_yv12[2][MAX_MB_PLANE];
  int last_besterr[2] = { INT_MAX, INT_MAX };
  const YV12_BUFFER_CONFIG *const scaled_ref_frame[2] = {
    av1_get_scaled_ref_frame(cpi, refs[0]),
    av1_get_scaled_ref_frame(cpi, refs[1])
  };

  // Prediction buffer from second frame.
  DECLARE_ALIGNED(16, uint8_t, second_pred16[MAX_SB_SQUARE * sizeof(uint16_t)]);
  uint8_t *second_pred = get_buf_by_bd(xd, second_pred16);

  int_mv best_mv, second_best_mv;

  // Allow joint search multiple times iteratively for each reference frame
  // and break out of the search loop if it couldn't find a better mv.
  for (ite = 0; ite < (2 * joint_me_num_refine_iter); ite++) {
    struct buf_2d ref_yv12[2];
    int bestsme = INT_MAX;
    int id = ite % 2;  // Even iterations search in the first reference frame,
                       // odd iterations search in the second. The predictor
                       // found for the 'other' reference frame is factored in.
    if (ite >= 2 && cur_mv[!id].as_int == init_mv[!id].as_int) {
      if (cur_mv[id].as_int == init_mv[id].as_int) {
        break;
      } else {
        int_mv cur_int_mv, init_int_mv;
        cur_int_mv.as_mv.col = cur_mv[id].as_mv.col >> 3;
        cur_int_mv.as_mv.row = cur_mv[id].as_mv.row >> 3;
        init_int_mv.as_mv.row = init_mv[id].as_mv.row >> 3;
        init_int_mv.as_mv.col = init_mv[id].as_mv.col >> 3;
        if (cur_int_mv.as_int == init_int_mv.as_int) {
          break;
        }
      }
    }
    for (ref = 0; ref < 2; ++ref) {
      ref_mv[ref] = av1_get_ref_mv(x, ref);
      // Swap out the reference frame for a version that's been scaled to
      // match the resolution of the current frame, allowing the existing
      // motion search code to be used without additional modifications.
      if (scaled_ref_frame[ref]) {
        int i;
        for (i = 0; i < num_planes; i++)
          backup_yv12[ref][i] = xd->plane[i].pre[ref];
        av1_setup_pre_planes(xd, ref, scaled_ref_frame[ref], mi_row, mi_col,
                             NULL, num_planes);
      }
    }

    assert(IMPLIES(scaled_ref_frame[0] != NULL,
                   cm->width == scaled_ref_frame[0]->y_crop_width &&
                       cm->height == scaled_ref_frame[0]->y_crop_height));
    assert(IMPLIES(scaled_ref_frame[1] != NULL,
                   cm->width == scaled_ref_frame[1]->y_crop_width &&
                       cm->height == scaled_ref_frame[1]->y_crop_height));

    // Initialize based on (possibly scaled) prediction buffers.
    ref_yv12[0] = xd->plane[plane].pre[0];
    ref_yv12[1] = xd->plane[plane].pre[1];

    av1_init_inter_params(&inter_pred_params, pw, ph, mi_row * MI_SIZE,
                          mi_col * MI_SIZE, 0, 0, xd->bd, is_cur_buf_hbd(xd), 0,
                          &cm->sf_identity, &ref_yv12[!id], interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, 0, xd->bd);

    // Since we have scaled the reference frames to match the size of the
    // current frame we must use a unit scaling factor during mode selection.
    av1_enc_build_one_inter_predictor(second_pred, pw, &cur_mv[!id].as_mv,
                                      &inter_pred_params);

    // Do full-pixel compound motion search on the current reference frame.
    if (id) xd->plane[plane].pre[0] = ref_yv12[id];

    // Make motion search params
    FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
    FULLPEL_MV_STATS best_mv_stats;
    const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
    const SEARCH_METHODS search_method =
        av1_get_default_mv_search_method(x, mv_sf, bsize);
    const search_site_config *src_search_sites =
        av1_get_search_site_config(cpi, x, search_method);
    // Use the mv result from the single mode as mv predictor.
    const FULLPEL_MV start_fullmv = get_fullmv_from_mv(&cur_mv[id].as_mv);
    av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                       &ref_mv[id].as_mv, start_fullmv,
                                       src_search_sites, search_method,
                                       /*fine_search_interval=*/0);

    av1_set_ms_compound_refs(&full_ms_params.ms_buffers, second_pred, mask,
                             mask_stride, id);

    // Small-range full-pixel motion search.
    if (!mv_sf->disable_extensive_joint_motion_search &&
        mbmi->interinter_comp.type != COMPOUND_WEDGE) {
      bestsme = av1_full_pixel_search(start_fullmv, &full_ms_params, 5, NULL,
                                      &best_mv.as_fullmv, &best_mv_stats,
                                      &second_best_mv.as_fullmv);
    } else {
      bestsme = av1_refining_search_8p_c(&full_ms_params, start_fullmv,
                                         &best_mv.as_fullmv);
      second_best_mv = best_mv;
    }

    const int try_second = second_best_mv.as_int != INVALID_MV &&
                           second_best_mv.as_int != best_mv.as_int &&
                           allow_second_mv;

    // Restore the pointer to the first (possibly scaled) prediction buffer.
    if (id) xd->plane[plane].pre[0] = ref_yv12[0];

    for (ref = 0; ref < 2; ++ref) {
      if (scaled_ref_frame[ref]) {
        // Swap back the original buffers for subpel motion search.
        for (int i = 0; i < num_planes; i++) {
          xd->plane[i].pre[ref] = backup_yv12[ref][i];
        }
        // Re-initialize based on unscaled prediction buffers.
        ref_yv12[ref] = xd->plane[plane].pre[ref];
      }
    }

    // Do sub-pixel compound motion search on the current reference frame.
    if (id) xd->plane[plane].pre[0] = ref_yv12[id];

    if (cpi->common.features.cur_frame_force_integer_mv) {
      convert_fullmv_to_mv(&best_mv);
    }
    if (bestsme < INT_MAX &&
        cpi->common.features.cur_frame_force_integer_mv == 0) {
      int dis; /* TODO: use dis in distortion calculation later. */
      unsigned int sse;
      SUBPEL_MOTION_SEARCH_PARAMS ms_params;
      av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                        &ref_mv[id].as_mv, NULL);
      av1_set_ms_compound_refs(&ms_params.var_params.ms_buffers, second_pred,
                               mask, mask_stride, id);
      ms_params.forced_stop = EIGHTH_PEL;
      MV start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
      assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, start_mv));
      bestsme = cpi->mv_search_params.find_fractional_mv_step(
          xd, cm, &ms_params, start_mv, NULL, &best_mv.as_mv, &dis, &sse, NULL);

      if (try_second) {
        MV this_best_mv;
        MV subpel_start_mv = get_mv_from_fullmv(&second_best_mv.as_fullmv);
        if (av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv)) {
          const int thissme = cpi->mv_search_params.find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, NULL, &this_best_mv, &dis,
              &sse, NULL);
          if (thissme < bestsme) {
            best_mv.as_mv = this_best_mv;
            bestsme = thissme;
          }
        }
      }
    }

    // Restore the pointer to the first prediction buffer.
    if (id) xd->plane[plane].pre[0] = ref_yv12[0];
    if (bestsme < last_besterr[id]) {
      cur_mv[id] = best_mv;
      last_besterr[id] = bestsme;
    } else {
      break;
    }
  }

  *rate_mv = 0;

  for (ref = 0; ref < 2; ++ref) {
    const int_mv curr_ref_mv = av1_get_ref_mv(x, ref);
    *rate_mv += av1_mv_bit_cost(&cur_mv[ref].as_mv, &curr_ref_mv.as_mv,
                                mv_costs->nmv_joint_cost,
                                mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }

  return AOMMIN(last_besterr[0], last_besterr[1]);
}